

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::save(CVmObjTable *this,CVmFile *fp)

{
  ushort uVar1;
  CVmFile *pCVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  CVmObjPageEntry **ppCVar8;
  uint uVar9;
  CVmObjPageEntry **ppCVar10;
  uint32_t tmp_1;
  vm_obj_id_t vVar11;
  long lVar12;
  long lVar13;
  CVmObjPageEntry *pCVar14;
  uint32_t tmp;
  uint32_t tmp_2;
  char b [4];
  undefined4 local_6c;
  CVmFile *local_68;
  CVmObjTable *local_60;
  CVmObjPageEntry **local_58;
  size_t local_50;
  long local_48;
  CVmObjPageEntry **local_40;
  size_t local_38;
  
  gc_pass_init(this);
  gc_pass_finish(this);
  add_metadeps_for_instances(this);
  local_68 = fp;
  CVmMetaTable::write_to_file(G_meta_table_X,fp);
  gc_trace_imports(this);
  gc_trace_globals(this);
  do {
    iVar4 = gc_pass_continue(this,0);
    pCVar2 = local_68;
  } while (iVar4 != 0);
  local_48 = ftell((FILE *)local_68->fp_);
  local_48 = local_48 - pCVar2->seek_base_;
  local_6c = 0;
  CVmFile::write_bytes(pCVar2,(char *)&local_6c,4);
  sVar6 = this->pages_used_;
  local_60 = this;
  if (sVar6 == 0) {
    lVar12 = 0;
    iVar4 = 0;
  }
  else {
    ppCVar8 = this->pages_;
    iVar4 = 0;
    lVar12 = 0;
    uVar9 = 0;
    do {
      pCVar14 = *ppCVar8;
      ppCVar10 = (CVmObjPageEntry **)(ulong)uVar9;
      lVar13 = 0;
      local_58 = ppCVar10;
      local_40 = ppCVar8;
      local_38 = sVar6;
      do {
        pCVar2 = local_68;
        uVar1 = *(ushort *)&pCVar14->field_0x14;
        if ((uVar1 & 0xf) == 8) {
          local_6c = (int)ppCVar10 + (int)lVar13;
          local_50 = lVar12;
          CVmFile::write_bytes(local_68,(char *)&local_6c,4);
          sVar6 = local_50;
          ppCVar10 = local_58;
          local_6c = uVar1 >> 7 & 1;
          CVmFile::write_bytes(pCVar2,(char *)&local_6c,4);
          lVar12 = sVar6 + 1;
        }
        if ((*(ushort *)&pCVar14->field_0x14 & 0x8d) == 8) {
          uVar9 = 1;
          if ((*(ushort *)&pCVar14->field_0x14 & 2) != 0) {
            iVar5 = (**(code **)(*(long *)&pCVar14->ptr_ + 0xe0))(pCVar14);
            uVar9 = (uint)(iVar5 != 0);
          }
        }
        else {
          uVar9 = 0;
        }
        iVar4 = iVar4 + uVar9;
        pCVar14 = pCVar14 + 1;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x1000);
      ppCVar8 = local_40 + 1;
      uVar9 = (int)ppCVar10 + 0x1000;
      sVar6 = local_38 - 1;
    } while (sVar6 != 0);
  }
  pCVar2 = local_68;
  lVar7 = ftell((FILE *)local_68->fp_);
  lVar13 = pCVar2->seek_base_;
  iVar5 = 0;
  fseek((FILE *)pCVar2->fp_,local_48 + lVar13,0);
  local_6c = (uint)lVar12;
  CVmFile::write_bytes(pCVar2,(char *)&local_6c,4);
  fseek((FILE *)pCVar2->fp_,(lVar7 - lVar13) + pCVar2->seek_base_,0);
  local_6c = iVar4;
  CVmFile::write_bytes(pCVar2,(char *)&local_6c,4);
  pCVar2 = local_68;
  local_50 = local_60->pages_used_;
  if (local_50 != 0) {
    local_58 = local_60->pages_;
    do {
      pCVar14 = *local_58;
      lVar12 = 0;
      do {
        vVar11 = (int)lVar12 + iVar5;
        if (((*(ushort *)&pCVar14->field_0x14 & 0x8d) == 8) &&
           (((*(ushort *)&pCVar14->field_0x14 & 2) == 0 ||
            (iVar4 = (**(code **)(*(long *)&pCVar14->ptr_ + 0xe0))(pCVar14), iVar4 != 0)))) {
          local_6c = vVar11;
          CVmFile::write_bytes(pCVar2,(char *)&local_6c,4);
          local_6c = CONCAT31(local_6c._1_3_,(byte)pCVar14->field_0x14 >> 1) & 0xffffff01;
          lVar13 = (*(code *)**(undefined8 **)&pCVar14->ptr_)(pCVar14);
          local_6c._0_2_ =
               CONCAT11((char)G_meta_table_X->reverse_map_[*(uint *)(lVar13 + 8)],(char)local_6c);
          CVmFile::write_bytes(pCVar2,(char *)&local_6c,2);
          (**(code **)(*(long *)&pCVar14->ptr_ + 0xe8))(pCVar14,pCVar2);
        }
        uVar1 = *(ushort *)&pCVar14->field_0x14;
        uVar3 = uVar1 & 0xfff3;
        *(ushort *)&pCVar14->field_0x14 = uVar3;
        if ((uVar1 & 2) != 0) {
          if ((uVar1 >> 9 & 1) != 0) {
            pCVar14->next_obj_ = local_60->gc_queue_head_;
            local_60->gc_queue_head_ = vVar11;
            uVar3 = *(ushort *)&pCVar14->field_0x14 & 0xfff3;
          }
          *(ushort *)&pCVar14->field_0x14 = uVar3 | 8;
        }
        pCVar14 = pCVar14 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x1000);
      local_58 = local_58 + 1;
      iVar5 = iVar5 + 0x1000;
      local_50 = local_50 - 1;
    } while (local_50 != 0);
  }
  return;
}

Assistant:

void CVmObjTable::save(VMG_ CVmFile *fp)
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;
    size_t toc_cnt;
    size_t save_cnt;
    long toc_cnt_pos;
    long end_pos;

    /*
     *   Before we save, perform a full GC pass.  This will ensure that we
     *   have removed all objects that are referenced only weakly, and
     *   cleaned up the weak references to them; this is important because
     *   we don't trace weak references for the purposes of calculating the
     *   set of objects that must be saved, and hence won't save any objects
     *   that are only weakly referenced, which would leave dangling
     *   references in the saved state if those weak references weren't
     *   cleaned up before the objects containing them are saved. 
     */
    gc_full(vmg0_);

    /* 
     *   Make sure that all of the metaclasses that we are actually using
     *   are in the metaclass dependency table.  We store the table in the
     *   file, because the table provides the mapping from file-local
     *   metaclass ID's to actual metaclasses; we must make sure that the
     *   table is complete (i.e., contains an entry for each metaclass of
     *   which there is an instance) before storing the table. 
     */
    add_metadeps_for_instances(vmg0_);

    /* save the metaclass table */
    G_meta_table->write_to_file(fp);

    /* 
     *   Figure out what objects we need to save.  We only need to save
     *   objects that are directly reachable from the root object set, from
     *   the imports, or from the globals.
     *   
     *   We don't need to save objects that are only accessible from the
     *   undo, because we don't save any undo information in the file.  We
     *   also don't need to save any objects that are reachable only from
     *   the stack, since the stack is inherently transient.
     *   
     *   Note that we don't need to trace from transient objects, since we
     *   won't be saving the transient objects and thus won't need to save
     *   anything referenced only from transient objects.
     *   
     *   So, we merely trace objects reachable from the imports, globals,
     *   and work queue.  At any time between GC passes, the work queue
     *   contains the complete list of root-set objects, hence we can simply
     *   trace from the current work queue.  
     */
    gc_trace_imports(vmg0_);
    gc_trace_globals(vmg0_);
    gc_trace_work_queue(vmg_ FALSE);

    /*
     *   Before we save the objects themselves, save a table of contents of
     *   the dynamically-allocated objects to be saved.  This table of
     *   contents will allow us to fix up references to objects on reloading
     *   the file with the new object numbers we assign them at that time.
     *   First, write a placeholder for the table of contents entry count.
     *   
     *   Note that we must store the table of contents in ascending order of
     *   object ID.  This happens naturally, since we scan the table in
     *   order of object ID.  
     */
    toc_cnt = 0;
    save_cnt = 0;
    toc_cnt_pos = fp->get_pos();
    fp->write_uint4(0);

    /* now scan the object pages and save the table of contents */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; -- j, ++entry, ++id)
        {
            /* 
             *   If the entry is currently reachable, and it was dynamically
             *   allocated (which means it's not in the root set), then add
             *   it to the table of contents.  Note that we won't
             *   necessarily be saving the object, because the object could
             *   be transient - but if so, then we still want the record of
             *   the transient object, so we'll know on reloading that the
             *   object is no longer available.  
             */
            if (!entry->free_
                && entry->reachable_ == VMOBJ_REACHABLE
                && !entry->in_root_set_)
            {
                ulong flags;
                
                /* set up the flags */
                flags = 0;
                if (entry->transient_)
                    flags |= VMOBJ_TOC_TRANSIENT;

                /* write the object ID and flags */
                fp->write_uint4(id);
                fp->write_uint4(flags);

                /* count it */
                ++toc_cnt;
            }

            /* if it's saveable, count it among the saveable objects */
            if (entry->is_saveable())
                ++save_cnt;
        }
    }

    /* go back and fix up the size prefix for the table of contents */
    end_pos = fp->get_pos();
    fp->set_pos(toc_cnt_pos);
    fp->write_uint4(toc_cnt);
    fp->set_pos(end_pos);

    /* write the saveable object count, which we calculated above */
    fp->write_uint4(save_cnt);

    /* scan all object pages, and save each reachable object */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; -- j, ++entry, ++id)
        {
            /* if this object is saveable, save it */
            if (entry->is_saveable())
            {
                uint idx;
                char buf[2];
                
                /* write the object ID */
                fp->write_uint4(id);

                /* store the root-set flag */
                buf[0] = (entry->in_root_set_ != 0);

                /* store the dependency table index */
                idx = entry->get_vm_obj()->
                      get_metaclass_reg()->get_reg_idx();
                buf[1] = (char)G_meta_table->get_dependency_index(idx);

                /* write the data */
                fp->write_bytes(buf, 2);

                /* save the metaclass-specific state */
                entry->get_vm_obj()->save_to_file(vmg_ fp);
            }
            
            /* 
             *   restore this object to the appropriate conditions in
             *   preparation for the next GC pass, so that we leave things
             *   as we found them -- saving the VM's state thus has no
             *   effect on the VM's state 
             */
            gc_set_init_conditions(id, entry);
        }
    }
}